

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomposer.cpp
# Opt level: O0

void test(int gid,ContinuousBounds *param_2,ContinuousBounds *bounds,ContinuousBounds *param_4,
         RegularContinuousLink *param_5)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  ExprLhs<const_float_&> rhs;
  ExprLhs<const_float_&> EVar1;
  AssertionHandler catchAssertionHandler_4;
  AssertionHandler catchAssertionHandler_3;
  AssertionHandler catchAssertionHandler_2;
  AssertionHandler catchAssertionHandler_1;
  int i;
  AssertionHandler catchAssertionHandler;
  undefined4 in_stack_fffffffffffffb68;
  Flags in_stack_fffffffffffffb6c;
  AssertionHandler *in_stack_fffffffffffffb70;
  StringRef *in_stack_fffffffffffffb78;
  SourceLineInfo *this;
  AssertionHandler *in_stack_fffffffffffffb80;
  char *in_stack_fffffffffffffb88;
  size_type in_stack_fffffffffffffb90;
  SourceLineInfo *this_00;
  int *in_stack_fffffffffffffba0;
  ExprLhs<const_float_&> *in_stack_fffffffffffffba8;
  SourceLineInfo *this_01;
  SourceLineInfo local_3c8;
  StringRef local_3b8;
  float *local_338;
  SourceLineInfo local_2f0;
  StringRef local_2e0;
  float *local_260;
  SourceLineInfo local_218;
  StringRef local_208;
  undefined4 local_1b0;
  float *local_1a8;
  SourceLineInfo local_160;
  StringRef local_150;
  int local_f4;
  undefined4 local_f0;
  int *local_d8;
  SourceLineInfo local_90;
  StringRef local_80;
  
  local_80 = operator____catch_sr
                       ((char *)in_stack_fffffffffffffb70,
                        CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_90,
             "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/decomposer.cpp"
             ,0xd);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffb80,(char *)in_stack_fffffffffffffb78);
  capturedExpression.m_size = in_stack_fffffffffffffb90;
  capturedExpression.m_start = in_stack_fffffffffffffb88;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
             (SourceLineInfo *)in_stack_fffffffffffffb70,capturedExpression,
             in_stack_fffffffffffffb6c);
  local_d8 = (int *)Catch::Decomposer::operator<=
                              ((Decomposer *)
                               CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                               (int *)0x147bc6);
  local_f0 = 0;
  Catch::ExprLhs<int_const&>::operator==
            ((ExprLhs<const_int_&> *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
  Catch::AssertionHandler::handleExpr
            (in_stack_fffffffffffffb70,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
  Catch::BinaryExpr<const_int_&,_const_int_&>::~BinaryExpr
            ((BinaryExpr<const_int_&,_const_int_&> *)0x147c28);
  Catch::AssertionHandler::complete(in_stack_fffffffffffffb70);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffb70);
  for (local_f4 = 0; local_f4 < 3; local_f4 = local_f4 + 1) {
    local_150 = operator____catch_sr
                          ((char *)in_stack_fffffffffffffb70,
                           CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    Catch::SourceLineInfo::SourceLineInfo
              (&local_160,
               "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/decomposer.cpp"
               ,0xf);
    Catch::StringRef::StringRef
              ((StringRef *)in_stack_fffffffffffffb80,(char *)in_stack_fffffffffffffb78);
    capturedExpression_00.m_size = in_stack_fffffffffffffb90;
    capturedExpression_00.m_start = in_stack_fffffffffffffb88;
    Catch::AssertionHandler::AssertionHandler
              (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
               (SourceLineInfo *)in_stack_fffffffffffffb70,capturedExpression_00,
               in_stack_fffffffffffffb6c);
    itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
              ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)in_stack_fffffffffffffb70,
               CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    local_1a8 = (float *)Catch::Decomposer::operator<=
                                   ((Decomposer *)
                                    CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                                    (float *)0x147d6e);
    local_1b0 = 0;
    Catch::ExprLhs<float_const&>::operator==(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
    Catch::AssertionHandler::handleExpr
              (in_stack_fffffffffffffb70,
               (ITransientExpression *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68)
              );
    Catch::BinaryExpr<const_float_&,_const_int_&>::~BinaryExpr
              ((BinaryExpr<const_float_&,_const_int_&> *)0x147dd0);
    Catch::AssertionHandler::complete(in_stack_fffffffffffffb70);
    Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffb70);
  }
  local_208 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffb70,
                         CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
  this_01 = &local_218;
  Catch::SourceLineInfo::SourceLineInfo
            (this_01,
             "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/decomposer.cpp"
             ,0x10);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffb80,(char *)in_stack_fffffffffffffb78);
  capturedExpression_01.m_size = in_stack_fffffffffffffb90;
  capturedExpression_01.m_start = in_stack_fffffffffffffb88;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
             (SourceLineInfo *)in_stack_fffffffffffffb70,capturedExpression_01,
             in_stack_fffffffffffffb6c);
  itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
            ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)in_stack_fffffffffffffb70,
             CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
  rhs = Catch::Decomposer::operator<=
                  ((Decomposer *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                   (float *)0x147fa2);
  local_260 = rhs.m_lhs;
  Catch::Detail::Approx::Approx
            ((Approx *)in_stack_fffffffffffffb70,
             (double)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
  Catch::ExprLhs<float_const&>::operator==((ExprLhs<const_float_&> *)this_01,(Approx *)rhs.m_lhs);
  Catch::AssertionHandler::handleExpr
            (in_stack_fffffffffffffb70,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
  Catch::BinaryExpr<const_float_&,_const_Catch::Detail::Approx_&>::~BinaryExpr
            ((BinaryExpr<const_float_&,_const_Catch::Detail::Approx_&> *)0x148010);
  Catch::AssertionHandler::complete(in_stack_fffffffffffffb70);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffb70);
  local_2e0 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffb70,
                         CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
  this_00 = &local_2f0;
  Catch::SourceLineInfo::SourceLineInfo
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/decomposer.cpp"
             ,0x11);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffb80,(char *)in_stack_fffffffffffffb78);
  capturedExpression_02.m_size = (size_type)this_00;
  capturedExpression_02.m_start = in_stack_fffffffffffffb88;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
             (SourceLineInfo *)in_stack_fffffffffffffb70,capturedExpression_02,
             in_stack_fffffffffffffb6c);
  itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
            ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)in_stack_fffffffffffffb70,
             CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
  EVar1 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                     (float *)0x14813e);
  local_338 = EVar1.m_lhs;
  Catch::Detail::Approx::Approx
            ((Approx *)in_stack_fffffffffffffb70,
             (double)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
  Catch::ExprLhs<float_const&>::operator==((ExprLhs<const_float_&> *)this_01,(Approx *)rhs.m_lhs);
  Catch::AssertionHandler::handleExpr
            (in_stack_fffffffffffffb70,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
  Catch::BinaryExpr<const_float_&,_const_Catch::Detail::Approx_&>::~BinaryExpr
            ((BinaryExpr<const_float_&,_const_Catch::Detail::Approx_&> *)0x1481ac);
  Catch::AssertionHandler::complete(in_stack_fffffffffffffb70);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffb70);
  local_3b8 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffb70,
                         CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
  this = &local_3c8;
  Catch::SourceLineInfo::SourceLineInfo
            (this,
             "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/decomposer.cpp"
             ,0x12);
  Catch::StringRef::StringRef((StringRef *)in_stack_fffffffffffffb80,(char *)this);
  capturedExpression_03.m_size = (size_type)this_00;
  capturedExpression_03.m_start = (char *)EVar1.m_lhs;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffb80,(StringRef *)this,(SourceLineInfo *)in_stack_fffffffffffffb70
             ,capturedExpression_03,in_stack_fffffffffffffb6c);
  itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
            ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)in_stack_fffffffffffffb70,
             CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
  EVar1 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                     (float *)0x148322);
  Catch::ExprLhs<float_const&>::operator==((ExprLhs<const_float_&> *)this_01,(double *)rhs.m_lhs);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)EVar1.m_lhs,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
  Catch::BinaryExpr<const_float_&,_const_double_&>::~BinaryExpr
            ((BinaryExpr<const_float_&,_const_double_&> *)0x148385);
  Catch::AssertionHandler::complete((AssertionHandler *)EVar1.m_lhs);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)EVar1.m_lhs);
  return;
}

Assistant:

void  test(int gid,                                         // block global id
           const diy::ContinuousBounds&,                    // block bounds without any ghost added
           const diy::ContinuousBounds& bounds,             // block bounds including ghost region
           const diy::ContinuousBounds&,                    // global data bounds
           const diy::RegularContinuousLink&)               // neighborhood
{
    REQUIRE(gid == 0);
    for (int i = 0; i < 3; ++i)
        REQUIRE(bounds.min[i] == 0);
    REQUIRE(bounds.max[0] == Approx(33.333));
    REQUIRE(bounds.max[1] == Approx(33.333));
    REQUIRE(bounds.max[2] == 100.);
}